

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall
Catch::RunContext::sectionStarted(RunContext *this,SectionInfo *sectionInfo,Counts *assertions)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  IStreamingReporter *pIVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  size_t sVar6;
  int iVar7;
  SectionTracker *pSVar8;
  NameAndLocation local_60;
  
  paVar1 = &local_60.name.field_2;
  pcVar2 = (sectionInfo->name)._M_dataplus._M_p;
  local_60.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + (sectionInfo->name)._M_string_length);
  local_60.location.file = (sectionInfo->lineInfo).file;
  local_60.location.line = (sectionInfo->lineInfo).line;
  pSVar8 = TestCaseTracking::SectionTracker::acquire(&this->m_trackerContext,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.name._M_dataplus._M_p,local_60.name.field_2._M_allocated_capacity + 1);
  }
  iVar7 = (*(pSVar8->super_TrackerBase).super_ITracker._vptr_ITracker[4])(pSVar8);
  if (SUB41(iVar7,0) != false) {
    local_60.name._M_dataplus._M_p = (pointer)pSVar8;
    std::
    vector<Catch::TestCaseTracking::ITracker*,std::allocator<Catch::TestCaseTracking::ITracker*>>::
    emplace_back<Catch::TestCaseTracking::ITracker*>
              ((vector<Catch::TestCaseTracking::ITracker*,std::allocator<Catch::TestCaseTracking::ITracker*>>
                *)&this->m_activeSections,(ITracker **)&local_60);
    uVar4 = *(undefined4 *)((long)&(sectionInfo->lineInfo).file + 4);
    sVar6 = (sectionInfo->lineInfo).line;
    uVar5 = *(undefined4 *)((long)&(sectionInfo->lineInfo).line + 4);
    *(undefined4 *)&(this->m_lastAssertionInfo).lineInfo.file =
         *(undefined4 *)&(sectionInfo->lineInfo).file;
    *(undefined4 *)((long)&(this->m_lastAssertionInfo).lineInfo.file + 4) = uVar4;
    *(int *)&(this->m_lastAssertionInfo).lineInfo.line = (int)sVar6;
    *(undefined4 *)((long)&(this->m_lastAssertionInfo).lineInfo.line + 4) = uVar5;
    pIVar3 = (this->m_reporter)._M_t.
             super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ._M_t.
             super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
    (*pIVar3->_vptr_IStreamingReporter[8])(pIVar3,sectionInfo);
    assertions->failedButOk = (this->m_totals).assertions.failedButOk;
    sVar6 = (this->m_totals).assertions.failed;
    assertions->passed = (this->m_totals).assertions.passed;
    assertions->failed = sVar6;
  }
  return SUB41(iVar7,0);
}

Assistant:

bool RunContext::sectionStarted(SectionInfo const & sectionInfo, Counts & assertions) {
        ITracker& sectionTracker = SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(sectionInfo.name, sectionInfo.lineInfo));
        if (!sectionTracker.isOpen())
            return false;
        m_activeSections.push_back(&sectionTracker);

        m_lastAssertionInfo.lineInfo = sectionInfo.lineInfo;

        m_reporter->sectionStarting(sectionInfo);

        assertions = m_totals.assertions;

        return true;
    }